

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::BuildOutputAnims_3DGS_MDL7(MDLImporter *this,IntBone_MDL7 **apcBonesOut)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  bool bVar5;
  aiAnimation *paVar6;
  size_type sVar7;
  const_reference pvVar8;
  double *pdVar9;
  ulong uVar10;
  aiNodeAnim **ppaVar11;
  aiNodeAnim *this_00;
  ulong uVar12;
  aiVectorKey *paVar13;
  aiQuatKey *paVar14;
  const_reference pvVar15;
  aiAnimation **ppaVar16;
  aiQuatKey *local_4f0;
  aiVectorKey *local_4c8;
  aiVectorKey *local_4a0;
  uint local_460;
  undefined1 local_45c [4];
  uint qq_1;
  aiNodeAnim *local_58;
  aiNodeAnim *pcNodeAnim;
  IntBone_MDL7 *intBone;
  uint32_t i_1;
  uint iCnt;
  ulong local_38;
  size_t qq;
  aiAnimation *paStack_28;
  uint32_t i;
  aiAnimation *pcAnim;
  Header_MDL7 *pcHeader;
  IntBone_MDL7 **apcBonesOut_local;
  MDLImporter *this_local;
  
  pcHeader = (Header_MDL7 *)apcBonesOut;
  apcBonesOut_local = (IntBone_MDL7 **)this;
  if (apcBonesOut == (IntBone_MDL7 **)0x0) {
    __assert_fail("__null != apcBonesOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLLoader.cpp"
                  ,0x6b2,
                  "void Assimp::MDLImporter::BuildOutputAnims_3DGS_MDL7(const MDL::IntBone_MDL7 **)"
                 );
  }
  pcAnim = (aiAnimation *)this->mBuffer;
  paVar6 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(paVar6);
  paStack_28 = paVar6;
  for (qq._4_4_ = 0; paVar6 = paStack_28, qq._4_4_ < *(uint *)((pcAnim->mName).data + 4);
      qq._4_4_ = qq._4_4_ + 1) {
    bVar5 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::empty
                      ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                       (*(long *)(pcHeader->ident + (ulong)qq._4_4_ * 8) + 0x468));
    if (!bVar5) {
      for (local_38 = 0; uVar10 = local_38,
          sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                            ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                             (*(long *)(pcHeader->ident + (ulong)qq._4_4_ * 8) + 0x468)),
          uVar10 < sVar7; local_38 = local_38 + 1) {
        pdVar9 = &paStack_28->mDuration;
        pvVar8 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                           ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                            (*(long *)(pcHeader->ident + (ulong)qq._4_4_ * 8) + 0x468),local_38);
        _i_1 = pvVar8->mTime;
        pdVar9 = std::max<double>(pdVar9,(double *)&i_1);
        paStack_28->mDuration = *pdVar9;
      }
      paStack_28->mNumChannels = paStack_28->mNumChannels + 1;
    }
  }
  if ((paStack_28->mDuration != 0.0) || (NAN(paStack_28->mDuration))) {
    auVar3 = ZEXT416(paStack_28->mNumChannels) * ZEXT816(8);
    uVar10 = auVar3._0_8_;
    if (auVar3._8_8_ != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    ppaVar11 = (aiNodeAnim **)operator_new__(uVar10);
    paStack_28->mChannels = ppaVar11;
    intBone._4_4_ = 0;
    for (intBone._0_4_ = 0; (uint)intBone < *(uint *)((pcAnim->mName).data + 4);
        intBone._0_4_ = (uint)intBone + 1) {
      bVar5 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::empty
                        ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                         (*(long *)(pcHeader->ident + (ulong)(uint)intBone * 8) + 0x468));
      if (!bVar5) {
        pcNodeAnim = *(aiNodeAnim **)(pcHeader->ident + (ulong)(uint)intBone * 8);
        this_00 = (aiNodeAnim *)operator_new(0x438);
        aiNodeAnim::aiNodeAnim(this_00);
        paStack_28->mChannels[intBone._4_4_] = this_00;
        local_58 = this_00;
        intBone._4_4_ = intBone._4_4_ + 1;
        aiString::aiString((aiString *)local_45c,&pcNodeAnim->mNodeName);
        aiString::operator=(&local_58->mNodeName,(aiString *)local_45c);
        sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                          ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                           (pcNodeAnim[1].mNodeName.data + 0x2c));
        local_58->mNumPositionKeys = (uint)sVar7;
        sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                          ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                           (pcNodeAnim[1].mNodeName.data + 0x2c));
        local_58->mNumScalingKeys = (uint)sVar7;
        sVar7 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::size
                          ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                           (pcNodeAnim[1].mNodeName.data + 0x2c));
        local_58->mNumRotationKeys = (uint)sVar7;
        uVar10 = CONCAT44(0,local_58->mNumPositionKeys);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar10;
        uVar12 = SUB168(auVar3 * ZEXT816(0x18),0);
        if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        paVar13 = (aiVectorKey *)operator_new__(uVar12);
        if (uVar10 != 0) {
          local_4a0 = paVar13;
          do {
            aiVectorKey::aiVectorKey(local_4a0);
            local_4a0 = local_4a0 + 1;
          } while (local_4a0 != paVar13 + uVar10);
        }
        local_58->mPositionKeys = paVar13;
        uVar10 = CONCAT44(0,local_58->mNumPositionKeys);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar10;
        uVar12 = SUB168(auVar1 * ZEXT816(0x18),0);
        if (SUB168(auVar1 * ZEXT816(0x18),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        paVar13 = (aiVectorKey *)operator_new__(uVar12);
        if (uVar10 != 0) {
          local_4c8 = paVar13;
          do {
            aiVectorKey::aiVectorKey(local_4c8);
            local_4c8 = local_4c8 + 1;
          } while (local_4c8 != paVar13 + uVar10);
        }
        local_58->mScalingKeys = paVar13;
        uVar10 = CONCAT44(0,local_58->mNumPositionKeys);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar10;
        uVar12 = SUB168(auVar2 * ZEXT816(0x18),0);
        if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        paVar14 = (aiQuatKey *)operator_new__(uVar12);
        if (uVar10 != 0) {
          local_4f0 = paVar14;
          do {
            aiQuatKey::aiQuatKey(local_4f0);
            local_4f0 = local_4f0 + 1;
          } while (local_4f0 != paVar14 + uVar10);
        }
        local_58->mRotationKeys = paVar14;
        for (local_460 = 0; local_460 < local_58->mNumPositionKeys; local_460 = local_460 + 1) {
          pvVar8 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                             ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                              (pcNodeAnim[1].mNodeName.data + 0x2c),(ulong)local_460);
          paVar13 = local_58->mPositionKeys + local_460;
          paVar13->mTime = pvVar8->mTime;
          fVar4 = (pvVar8->mValue).y;
          (paVar13->mValue).x = (pvVar8->mValue).x;
          (paVar13->mValue).y = fVar4;
          (paVar13->mValue).z = (pvVar8->mValue).z;
          pvVar8 = std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::operator[]
                             ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)
                              (pcNodeAnim[1].mNodeName.data + 0x44),(ulong)local_460);
          paVar13 = local_58->mScalingKeys + local_460;
          paVar13->mTime = pvVar8->mTime;
          fVar4 = (pvVar8->mValue).y;
          (paVar13->mValue).x = (pvVar8->mValue).x;
          (paVar13->mValue).y = fVar4;
          (paVar13->mValue).z = (pvVar8->mValue).z;
          pvVar15 = std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::operator[]
                              ((vector<aiQuatKey,_std::allocator<aiQuatKey>_> *)
                               (pcNodeAnim[1].mNodeName.data + 0x5c),(ulong)local_460);
          paVar14 = local_58->mRotationKeys + local_460;
          paVar14->mTime = pvVar15->mTime;
          fVar4 = (pvVar15->mValue).x;
          (paVar14->mValue).w = (pvVar15->mValue).w;
          (paVar14->mValue).x = fVar4;
          fVar4 = (pvVar15->mValue).z;
          (paVar14->mValue).y = (pvVar15->mValue).y;
          (paVar14->mValue).z = fVar4;
        }
      }
    }
    this->pScene->mNumAnimations = 1;
    ppaVar16 = (aiAnimation **)operator_new__(8);
    this->pScene->mAnimations = ppaVar16;
    *this->pScene->mAnimations = paStack_28;
  }
  else if (paStack_28 != (aiAnimation *)0x0) {
    aiAnimation::~aiAnimation(paStack_28);
    operator_delete(paVar6);
  }
  return;
}

Assistant:

void MDLImporter::BuildOutputAnims_3DGS_MDL7(
    const MDL::IntBone_MDL7** apcBonesOut)
{
    ai_assert(NULL != apcBonesOut);
    const MDL::Header_MDL7* const pcHeader = (const MDL::Header_MDL7*)mBuffer;

    // one animation ...
    aiAnimation* pcAnim = new aiAnimation();
    for (uint32_t i = 0; i < pcHeader->bones_num;++i)   {
        if (!apcBonesOut[i]->pkeyPositions.empty()) {

            // get the last frame ... (needn't be equal to pcHeader->frames_num)
            for (size_t qq = 0; qq < apcBonesOut[i]->pkeyPositions.size();++qq) {
                pcAnim->mDuration = std::max(pcAnim->mDuration, (double)
                    apcBonesOut[i]->pkeyPositions[qq].mTime);
            }
            ++pcAnim->mNumChannels;
        }
    }
    if (pcAnim->mDuration)  {
        pcAnim->mChannels = new aiNodeAnim*[pcAnim->mNumChannels];

        unsigned int iCnt = 0;
        for (uint32_t i = 0; i < pcHeader->bones_num;++i)   {
            if (!apcBonesOut[i]->pkeyPositions.empty()) {
                const MDL::IntBone_MDL7* const intBone = apcBonesOut[i];

                aiNodeAnim* const pcNodeAnim = pcAnim->mChannels[iCnt++] = new aiNodeAnim();
                pcNodeAnim->mNodeName = aiString( intBone->mName );

                // allocate enough storage for all keys
                pcNodeAnim->mNumPositionKeys = (unsigned int)intBone->pkeyPositions.size();
                pcNodeAnim->mNumScalingKeys  = (unsigned int)intBone->pkeyPositions.size();
                pcNodeAnim->mNumRotationKeys = (unsigned int)intBone->pkeyPositions.size();

                pcNodeAnim->mPositionKeys = new aiVectorKey[pcNodeAnim->mNumPositionKeys];
                pcNodeAnim->mScalingKeys  = new aiVectorKey[pcNodeAnim->mNumPositionKeys];
                pcNodeAnim->mRotationKeys = new aiQuatKey[pcNodeAnim->mNumPositionKeys];

                // copy all keys
                for (unsigned int qq = 0; qq < pcNodeAnim->mNumPositionKeys;++qq)   {
                    pcNodeAnim->mPositionKeys[qq] = intBone->pkeyPositions[qq];
                    pcNodeAnim->mScalingKeys[qq] = intBone->pkeyScalings[qq];
                    pcNodeAnim->mRotationKeys[qq] = intBone->pkeyRotations[qq];
                }
            }
        }

        // store the output animation
        pScene->mNumAnimations = 1;
        pScene->mAnimations = new aiAnimation*[1];
        pScene->mAnimations[0] = pcAnim;
    }
    else delete pcAnim;
}